

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void boost::detail::
     sp_pointer_construct<boost::spirit::classic::impl::grammar_helper<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>,boost::spirit::classic::impl::grammar_helper<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>>
               (shared_ptr<boost::spirit::classic::impl::grammar_helper<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>_>_>
                *ppx,grammar_helper<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>_>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,_boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>_>
                     *p,shared_count *pn)

{
  sp_counted_base *psVar1;
  sp_counted_base *in_RAX;
  shared_count local_18;
  
  local_18.pi_ = in_RAX;
  shared_count::
  shared_count<boost::spirit::classic::impl::grammar_helper<boost::spirit::classic::grammar<POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,boost::spirit::classic::parser_context<boost::spirit::classic::nil_t>>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::POMDPFileParser,boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>>
            (&local_18,p);
  psVar1 = pn->pi_;
  pn->pi_ = (sp_counted_base *)local_18;
  local_18.pi_ = psVar1;
  shared_count::~shared_count(&local_18);
  return;
}

Assistant:

inline void sp_pointer_construct( boost::shared_ptr< T > * ppx, Y * p, boost::detail::shared_count & pn )
{
    boost::detail::shared_count( p ).swap( pn );
    boost::detail::sp_enable_shared_from_this( ppx, p, p );
}